

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_trie.hpp
# Opt level: O1

void __thiscall
poplar::
compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compact_fkhash_trie
          (compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                 *param_2)

{
  pointer puVar1;
  uint64_t uVar2;
  pointer psVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  *pvVar13;
  undefined4 uVar14;
  uint32_t uVar15;
  undefined4 uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  undefined4 uVar19;
  uint32_t uVar20;
  undefined4 uVar21;
  uint32_t uVar22;
  undefined4 uVar23;
  uint32_t uVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  
  (this->hasher_).univ_size_.mask_ = (param_2->hasher_).univ_size_.mask_;
  uVar14 = *(undefined4 *)&(param_2->hasher_).field_0x4;
  uVar15 = (param_2->hasher_).univ_size_.bits_;
  uVar16 = *(undefined4 *)&(param_2->hasher_).univ_size_.field_0x4;
  (this->hasher_).shift_ = (param_2->hasher_).shift_;
  *(undefined4 *)&(this->hasher_).field_0x4 = uVar14;
  (this->hasher_).univ_size_.bits_ = uVar15;
  *(undefined4 *)&(this->hasher_).univ_size_.field_0x4 = uVar16;
  puVar1 = (param_2->table_).chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar26 = ZEXT816(0) << 0x20;
  pvVar12 = &(param_2->table_).chunks_;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar26._0_8_;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar26._8_8_;
  (this->table_).width_ = (param_2->table_).width_;
  uVar2 = (param_2->table_).mask_;
  (this->table_).size_ = (param_2->table_).size_;
  (this->table_).mask_ = uVar2;
  uVar14 = *(undefined4 *)&(param_2->aux_cht_).hasher_.field_0x4;
  uVar15 = (param_2->aux_cht_).hasher_.univ_size_.bits_;
  uVar16 = *(undefined4 *)&(param_2->aux_cht_).hasher_.univ_size_.field_0x4;
  (this->aux_cht_).hasher_.shift_ = (param_2->aux_cht_).hasher_.shift_;
  *(undefined4 *)&(this->aux_cht_).hasher_.field_0x4 = uVar14;
  (this->aux_cht_).hasher_.univ_size_.bits_ = uVar15;
  *(undefined4 *)&(this->aux_cht_).hasher_.univ_size_.field_0x4 = uVar16;
  (this->aux_cht_).hasher_.univ_size_.mask_ = (param_2->aux_cht_).hasher_.univ_size_.mask_;
  puVar1 = (param_2->aux_cht_).table_.chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->aux_cht_).table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_2->aux_cht_).table_.chunks_.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->aux_cht_).table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->aux_cht_).table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->aux_cht_).table_.chunks_.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_2->aux_cht_).table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar12 = &(param_2->aux_cht_).table_.chunks_;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar26._0_8_;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar26._8_8_;
  (this->aux_cht_).table_.width_ = (param_2->aux_cht_).table_.width_;
  uVar2 = (param_2->aux_cht_).table_.mask_;
  (this->aux_cht_).table_.size_ = (param_2->aux_cht_).table_.size_;
  (this->aux_cht_).table_.mask_ = uVar2;
  uVar2 = (param_2->aux_cht_).max_size_;
  uVar15 = (param_2->aux_cht_).univ_size_.bits_;
  uVar14 = *(undefined4 *)&(param_2->aux_cht_).univ_size_.field_0x4;
  uVar4 = (param_2->aux_cht_).univ_size_.mask_;
  uVar17 = (param_2->aux_cht_).capa_size_.bits_;
  uVar16 = *(undefined4 *)&(param_2->aux_cht_).capa_size_.field_0x4;
  uVar5 = (param_2->aux_cht_).capa_size_.mask_;
  uVar18 = (param_2->aux_cht_).quo_size_.bits_;
  uVar19 = *(undefined4 *)&(param_2->aux_cht_).quo_size_.field_0x4;
  uVar6 = (param_2->aux_cht_).quo_size_.mask_;
  uVar20 = (param_2->aux_cht_).univ_size_.bits_;
  uVar21 = *(undefined4 *)&(param_2->aux_cht_).univ_size_.field_0x4;
  uVar7 = (param_2->aux_cht_).univ_size_.mask_;
  uVar22 = (param_2->aux_cht_).capa_size_.bits_;
  uVar23 = *(undefined4 *)&(param_2->aux_cht_).capa_size_.field_0x4;
  uVar8 = (param_2->aux_cht_).capa_size_.mask_;
  uVar24 = (param_2->aux_cht_).quo_size_.bits_;
  uVar25 = *(undefined4 *)&(param_2->aux_cht_).quo_size_.field_0x4;
  uVar9 = (param_2->aux_cht_).quo_size_.mask_;
  uVar10 = (param_2->aux_cht_).quo_shift_;
  uVar11 = (param_2->aux_cht_).quo_invmask_;
  (this->aux_cht_).size_ = (param_2->aux_cht_).size_;
  (this->aux_cht_).max_size_ = uVar2;
  (this->aux_cht_).univ_size_.bits_ = uVar15;
  *(undefined4 *)&(this->aux_cht_).univ_size_.field_0x4 = uVar14;
  (this->aux_cht_).univ_size_.mask_ = uVar4;
  (this->aux_cht_).capa_size_.bits_ = uVar17;
  *(undefined4 *)&(this->aux_cht_).capa_size_.field_0x4 = uVar16;
  (this->aux_cht_).capa_size_.mask_ = uVar5;
  (this->aux_cht_).quo_size_.bits_ = uVar18;
  *(undefined4 *)&(this->aux_cht_).quo_size_.field_0x4 = uVar19;
  (this->aux_cht_).quo_size_.mask_ = uVar6;
  (this->aux_cht_).univ_size_.bits_ = uVar20;
  *(undefined4 *)&(this->aux_cht_).univ_size_.field_0x4 = uVar21;
  (this->aux_cht_).univ_size_.mask_ = uVar7;
  (this->aux_cht_).capa_size_.bits_ = uVar22;
  *(undefined4 *)&(this->aux_cht_).capa_size_.field_0x4 = uVar23;
  (this->aux_cht_).capa_size_.mask_ = uVar8;
  (this->aux_cht_).quo_size_.bits_ = uVar24;
  *(undefined4 *)&(this->aux_cht_).quo_size_.field_0x4 = uVar25;
  (this->aux_cht_).quo_size_.mask_ = uVar9;
  (this->aux_cht_).quo_shift_ = uVar10;
  (this->aux_cht_).quo_invmask_ = uVar11;
  psVar3 = (param_2->aux_map_).table_.
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->aux_map_).table_.
       super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar13 = &(param_2->aux_map_).table_;
  (pvVar13->
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)auVar26._0_8_;
  (pvVar13->
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar26._8_8_;
  uVar2 = (param_2->aux_map_).max_size_;
  uVar15 = (param_2->aux_map_).capa_size_.bits_;
  uVar14 = *(undefined4 *)&(param_2->aux_map_).capa_size_.field_0x4;
  uVar4 = (param_2->aux_map_).capa_size_.mask_;
  (this->aux_map_).size_ = (param_2->aux_map_).size_;
  (this->aux_map_).max_size_ = uVar2;
  (this->aux_map_).capa_size_.bits_ = uVar15;
  *(undefined4 *)&(this->aux_map_).capa_size_.field_0x4 = uVar14;
  (this->aux_map_).capa_size_.mask_ = uVar4;
  puVar1 = (param_2->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar12 = &(param_2->ids_).chunks_;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar26._0_8_;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar26._8_8_;
  (this->ids_).width_ = (param_2->ids_).width_;
  uVar2 = (param_2->ids_).mask_;
  (this->ids_).size_ = (param_2->ids_).size_;
  (this->ids_).mask_ = uVar2;
  uVar2 = param_2->max_size_;
  uVar15 = (param_2->capa_size_).bits_;
  uVar14 = *(undefined4 *)&(param_2->capa_size_).field_0x4;
  uVar4 = (param_2->capa_size_).mask_;
  uVar17 = (param_2->capa_size_).bits_;
  uVar16 = *(undefined4 *)&(param_2->capa_size_).field_0x4;
  uVar5 = (param_2->capa_size_).mask_;
  uVar18 = (param_2->symb_size_).bits_;
  uVar19 = *(undefined4 *)&(param_2->symb_size_).field_0x4;
  uVar6 = (param_2->symb_size_).mask_;
  this->size_ = param_2->size_;
  this->max_size_ = uVar2;
  (this->capa_size_).bits_ = uVar15;
  *(undefined4 *)&(this->capa_size_).field_0x4 = uVar14;
  (this->capa_size_).mask_ = uVar4;
  (this->capa_size_).bits_ = uVar17;
  *(undefined4 *)&(this->capa_size_).field_0x4 = uVar16;
  (this->capa_size_).mask_ = uVar5;
  (this->symb_size_).bits_ = uVar18;
  *(undefined4 *)&(this->symb_size_).field_0x4 = uVar19;
  (this->symb_size_).mask_ = uVar6;
  return;
}

Assistant:

compact_fkhash_trie(compact_fkhash_trie&&) noexcept = default;